

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_ACCBANDS_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                   int *outNBElement)

{
  TA_RetCode TVar1;
  double *unaff_RBX;
  undefined8 in_RDI;
  double *unaff_R14;
  double *unaff_retaddr;
  int in_stack_0000000c;
  int in_stack_00000010;
  int *in_stack_00000020;
  
  TVar1 = TA_ACCBANDS(in_stack_00000010,in_stack_0000000c,unaff_retaddr,unaff_R14,unaff_RBX,
                      (int)((ulong)in_RDI >> 0x20),in_stack_00000020,outNBElement,
                      (double *)outBegIdx,(double *)CONCAT44(startIdx,endIdx),(double *)params);
  return TVar1;
}

Assistant:

TA_RetCode TA_ACCBANDS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_ACCBANDS(
/* Generated */                  startIdx,
/* Generated */                  endIdx,
/* Generated */                  params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                  params->in[0].data.inPrice.low, /* inLow */
/* Generated */                  params->in[0].data.inPrice.close, /* inClose */
/* Generated */                  params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                  outBegIdx, 
/* Generated */                  outNBElement, 
/* Generated */                  params->out[0].data.outReal, /*  outRealUpperBand */
/* Generated */                  params->out[1].data.outReal, /*  outRealMiddleBand */
/* Generated */                  params->out[2].data.outReal /*  outRealLowerBand */ );
/* Generated */ }